

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abeta.hpp
# Opt level: O0

double minimax::ABeta_<ttt::Board,minimax::Eval<ttt::Board>>
                 (Board *game,int depth,double alfa,double beta)

{
  IPlayer IVar1;
  bool bVar2;
  int iVar3;
  int in_ESI;
  Board *in_RDI;
  pointer in_XMM0_Qa;
  double dVar4;
  double in_XMM1_Qa;
  double r;
  Board new_game;
  long m;
  iterator __end0;
  iterator __begin0;
  vector<long,_std::allocator<long>_> *__range2;
  vector<long,_std::allocator<long>_> moves;
  double result;
  bool result_set;
  int status;
  Eval<ttt::Board> evaluator;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff48;
  Board *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  Board *in_stack_ffffffffffffff60;
  Board *in_stack_ffffffffffffff88;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_68;
  undefined1 *local_60;
  undefined1 local_58 [24];
  Board *local_40;
  byte local_31;
  undefined4 in_stack_ffffffffffffffd4;
  int depth_00;
  undefined4 in_stack_ffffffffffffffe8;
  Board *local_8;
  
  if (in_ESI == 0) {
    local_8 = (Board *)Eval<ttt::Board>::operator()
                                 ((Eval<ttt::Board> *)
                                  CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                  in_stack_ffffffffffffff50);
  }
  else {
    iVar3 = ttt::Board::GetStatus((Board *)0x1f2052);
    if (iVar3 == -1) {
      local_31 = 0;
      local_40 = (Board *)0x0;
      ttt::Board::GetPossibleMoves(in_stack_ffffffffffffff88);
      local_60 = local_58;
      local_68._M_current =
           (long *)std::vector<long,_std::allocator<long>_>::begin(in_stack_ffffffffffffff48);
      std::vector<long,_std::allocator<long>_>::end(in_stack_ffffffffffffff48);
      while (depth_00 = (int)((ulong)in_XMM0_Qa >> 0x20),
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                *)in_stack_ffffffffffffff50,
                               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                *)in_stack_ffffffffffffff48), bVar2) {
        __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator*
                  (&local_68);
        ttt::Board::ApplyMove
                  (in_stack_ffffffffffffff60,
                   (IMove *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        in_stack_ffffffffffffff50 =
             (Board *)ABeta_<ttt::Board,minimax::Eval<ttt::Board>>
                                ((Board *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),depth_00,
                                 in_XMM1_Qa,(double)CONCAT44(in_stack_ffffffffffffffd4,iVar3));
        in_stack_ffffffffffffff60 = (Board *)-(double)in_stack_ffffffffffffff50;
        if (((local_31 & 1) == 0) || ((double)local_40 < (double)in_stack_ffffffffffffff60)) {
          local_31 = 1;
          local_40 = in_stack_ffffffffffffff60;
        }
        in_stack_ffffffffffffff48 =
             (vector<long,_std::allocator<long>_> *)
             std::max<double>((double *)&stack0xffffffffffffffe0,(double *)&stack0xffffffffffffff60)
        ;
        in_XMM0_Qa = (in_stack_ffffffffffffff48->super__Vector_base<long,_std::allocator<long>_>).
                     _M_impl.super__Vector_impl_data._M_start;
        if (in_XMM1_Qa <= (double)in_XMM0_Qa) break;
        __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                  (&local_68);
      }
      local_8 = local_40;
      std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff60);
    }
    else if (iVar3 == 0) {
      local_8 = (Board *)0x0;
    }
    else {
      IVar1 = ttt::Board::GetPlayerToMove(in_RDI);
      if (iVar3 == IVar1) {
        local_8 = (Board *)std::numeric_limits<double>::max();
      }
      else {
        dVar4 = std::numeric_limits<double>::max();
        local_8 = (Board *)((ulong)dVar4 ^ 0x8000000000000000);
      }
    }
  }
  return (double)local_8;
}

Assistant:

static double
ABeta_(const IGame &game, int depth, double alfa, double beta)
{
    Eval evaluator;

    if (depth == 0)
        return evaluator(game);

    auto status = game.GetStatus();
    if (status != game::Undecided)
    {
        if (status == game::Draw)
            return 0.0;
        if (status == game.GetPlayerToMove())
            return std::numeric_limits<double>::max();
        return -std::numeric_limits<double>::max();
    }

    bool result_set = false;
    double result = 0.0;
    auto moves = game.GetPossibleMoves();
    for (auto m : moves)
    {
        IGame new_game(game);
        new_game.ApplyMove(m);
        auto r = -ABeta_<IGame, Eval>(new_game, depth - 1, -beta, -alfa);
        if (!result_set || r > result)
            result = r, result_set = true;
        alfa = std::max(alfa, r);
        if (alfa >= beta)
            break;
    }

    return result;
}